

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Entry * __thiscall
kj::
Table<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks>_>
::insert(Table<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks>_>
         *this,Entry *row)

{
  Entry *pEVar1;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,this,((long)(this->rows).builder.pos - (long)(this->rows).builder.ptr) / 0x50,
             row,0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    pEVar1 = Vector<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry>::
             add<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry>
                       ((Vector<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry> *)this
                        ,row);
    return pEVar1;
  }
  kj::_::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  KJ_IF_MAYBE(existing, Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }